

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O1

void Abc_NtkUpdateReverseLevel(Abc_Obj_t *pObjNew,Vec_Vec_t *vLevels)

{
  void **ppvVar1;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pObj_00;
  uint Level;
  uint uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  Level = Abc_ObjReverseLevel(pObjNew);
  uVar2 = Abc_ObjReverseLevelNew(pObjNew);
  if (Level != uVar2) {
    iVar3 = vLevels->nSize;
    if (0 < (long)iVar3) {
      ppvVar1 = vLevels->pArray;
      lVar4 = 0;
      do {
        *(undefined4 *)((long)ppvVar1[lVar4] + 4) = 0;
        lVar4 = lVar4 + 1;
      } while (iVar3 != lVar4);
    }
    Vec_VecPush(vLevels,Level,pObjNew);
    pObjNew->field_0x14 = pObjNew->field_0x14 | 0x10;
    if ((int)Level < vLevels->nSize) {
      uVar6 = (ulong)Level;
      do {
        if ((int)Level < 0) {
LAB_0031dd1d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                        ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
        }
        lVar4 = 0;
        while( true ) {
          if (vLevels->nSize <= (int)uVar6) goto LAB_0031dd1d;
          if (*(int *)((long)vLevels->pArray[uVar6] + 4) <= lVar4) break;
          pObj = *(Abc_Obj_t **)(*(long *)((long)vLevels->pArray[uVar6] + 8) + lVar4 * 8);
          *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xffffffef;
          uVar2 = Abc_ObjReverseLevel(pObj);
          if (uVar6 != uVar2) {
            __assert_fail("LevelOld == Lev",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcTiming.c"
                          ,0x547,"void Abc_NtkUpdateReverseLevel(Abc_Obj_t *, Vec_Vec_t *)");
          }
          iVar3 = Abc_ObjReverseLevelNew(pObj);
          Abc_ObjSetReverseLevel(pObj,iVar3);
          uVar2 = Abc_ObjReverseLevel(pObj);
          if ((uVar6 != uVar2) && (0 < (pObj->vFanins).nSize)) {
            lVar5 = 0;
            do {
              pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar5]];
              if ((((*(uint *)&pObj_00->field_0x14 & 0x10) == 0) &&
                  (uVar2 = *(uint *)&pObj_00->field_0x14 & 0xf, uVar2 != 2)) && (uVar2 != 5)) {
                iVar3 = Abc_ObjReverseLevel(pObj_00);
                if (iVar3 < (int)uVar6) {
                  __assert_fail("LevFanin >= Lev",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcTiming.c"
                                ,0x552,"void Abc_NtkUpdateReverseLevel(Abc_Obj_t *, Vec_Vec_t *)");
                }
                Vec_VecPush(vLevels,iVar3,pObj_00);
                pObj_00->field_0x14 = pObj_00->field_0x14 | 0x10;
              }
              lVar5 = lVar5 + 1;
            } while (lVar5 < (pObj->vFanins).nSize);
          }
          lVar4 = lVar4 + 1;
          if ((int)Level < 0) goto LAB_0031dd1d;
        }
        uVar6 = uVar6 + 1;
      } while ((int)uVar6 < vLevels->nSize);
    }
  }
  return;
}

Assistant:

void Abc_NtkUpdateReverseLevel( Abc_Obj_t * pObjNew, Vec_Vec_t * vLevels )
{
    Abc_Obj_t * pFanin, * pTemp;
    int LevelOld, LevFanin, Lev, k, m;
    // check if level has changed
    LevelOld = Abc_ObjReverseLevel(pObjNew);
    if ( LevelOld == Abc_ObjReverseLevelNew(pObjNew) )
        return;
    // start the data structure for level update
    // we cannot fail to visit a node when using this structure because the 
    // nodes are stored by their _old_ levels, which are assumed to be correct
    Vec_VecClear( vLevels );
    Vec_VecPush( vLevels, LevelOld, pObjNew );
    pObjNew->fMarkA = 1;
    // recursively update level
    Vec_VecForEachEntryStart( Abc_Obj_t *, vLevels, pTemp, Lev, k, LevelOld )
    {
        pTemp->fMarkA = 0;
        LevelOld = Abc_ObjReverseLevel(pTemp); 
        assert( LevelOld == Lev );
        Abc_ObjSetReverseLevel( pTemp, Abc_ObjReverseLevelNew(pTemp) );
        // if the level did not change, no need to check the fanout levels
        if ( Abc_ObjReverseLevel(pTemp) == Lev )
            continue;
        // schedule fanins for level update
        Abc_ObjForEachFanin( pTemp, pFanin, m )
        {
            if ( !Abc_ObjIsCi(pFanin) && !pFanin->fMarkA )
            {
                LevFanin = Abc_ObjReverseLevel( pFanin );
                assert( LevFanin >= Lev );
                Vec_VecPush( vLevels, LevFanin, pFanin );
                pFanin->fMarkA = 1;
            }
        }
    }
}